

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLcode Curl_getformdata(SessionHandle *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  ulong uVar1;
  long lVar2;
  FormData *pFVar3;
  FormData **ppFVar4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  FILE *__stream;
  size_t length;
  FormData *pFVar9;
  size_t length_00;
  formtype type;
  CURLcode CVar10;
  curl_slist *pcVar11;
  curl_httppost *file;
  curl_off_t size;
  FormData *form;
  char buffer [512];
  curl_off_t local_280;
  FormData *local_278;
  char *local_270;
  char *local_268;
  FormData **local_260;
  SessionHandle *local_258;
  FormData *local_250;
  long *local_248;
  curl_httppost *local_240;
  undefined1 local_238 [520];
  
  CVar5 = CURLE_OK;
  local_278 = (FormData *)0x0;
  local_280 = 0;
  *finalform = (FormData *)0x0;
  if (post != (curl_httppost *)0x0) {
    local_248 = sizep;
    pcVar7 = formboundary(data);
    if (pcVar7 == (char *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
    }
    else {
      pcVar8 = "Content-Type: multipart/form-data";
      if (custom_content_type != (char *)0x0) {
        pcVar8 = custom_content_type;
      }
      CVar5 = AddFormDataf(&local_278,(curl_off_t *)0x0,"%s; boundary=%s\r\n",pcVar8,pcVar7);
      if (CVar5 == CURLE_OK) {
        local_250 = local_278;
        pcVar8 = (char *)0x0;
        local_268 = pcVar7;
        local_260 = finalform;
        local_258 = data;
        do {
          if (((((local_280 != 0) &&
                (CVar5 = AddFormDataf(&local_278,&local_280,"\r\n"), CVar5 != CURLE_OK)) ||
               (CVar5 = AddFormDataf(&local_278,&local_280,"--%s\r\n",pcVar7), CVar5 != CURLE_OK))
              || ((CVar5 = AddFormDataf(&local_278,&local_280,
                                        "Content-Disposition: form-data; name=\""),
                  CVar5 != CURLE_OK ||
                  (CVar5 = AddFormData(&local_278,FORM_DATA,post->name,post->namelength,&local_280),
                  CVar5 != CURLE_OK)))) ||
             (CVar5 = AddFormDataf(&local_278,&local_280,"\""), CVar5 != CURLE_OK))
          goto LAB_0012f211;
          if (post->more != (curl_httppost *)0x0) {
            (*Curl_cfree)(pcVar8);
            pcVar8 = formboundary(local_258);
            if (pcVar8 == (char *)0x0) {
              CVar5 = CURLE_OUT_OF_MEMORY;
              pcVar8 = (char *)0x0;
              goto LAB_0012f211;
            }
            CVar5 = AddFormDataf(&local_278,&local_280,
                                 "\r\nContent-Type: multipart/mixed; boundary=%s\r\n",pcVar8);
            if (CVar5 != CURLE_OK) goto LAB_0012f211;
          }
          CVar5 = CURLE_OK;
          file = post;
          local_270 = pcVar8;
LAB_0012ef52:
          if (file->more != (curl_httppost *)0x0) {
            CVar5 = AddFormDataf(&local_278,&local_280,"\r\n--%s\r\nContent-Disposition: attachment"
                                 ,local_270);
            if ((CVar5 != CURLE_OK) ||
               (CVar5 = formdata_add_filename(post,&local_278,&local_280), CVar5 != CURLE_OK))
            goto LAB_0012f1c8;
LAB_0012efbe:
            CVar5 = CURLE_OK;
LAB_0012efc1:
            CVar10 = CVar5;
            if (post->contenttype != (char *)0x0) {
              CVar10 = CURLE_OK;
              CVar5 = AddFormDataf(&local_278,&local_280,"\r\nContent-Type: %s");
              if (CVar5 != CURLE_OK) goto LAB_0012f1c8;
            }
            pcVar11 = post->contentheader;
            CVar5 = CVar10;
            if (pcVar11 != (curl_slist *)0x0) {
              do {
                CVar5 = AddFormDataf(&local_278,&local_280,"\r\n%s");
                if (CVar5 != CURLE_OK) goto LAB_0012f01f;
                pcVar11 = pcVar11->next;
              } while (pcVar11 != (curl_slist *)0x0);
              CVar5 = CURLE_OK;
            }
LAB_0012f01f:
            if ((CVar5 != CURLE_OK) ||
               (CVar5 = AddFormDataf(&local_278,&local_280,"\r\n\r\n"), CVar5 != CURLE_OK))
            goto LAB_0012f1c8;
            uVar1 = file->flags;
            if ((uVar1 & 3) == 0) {
              if ((uVar1 & 0x10) == 0) {
                if ((uVar1 & 0x40) != 0) {
                  lVar2 = file->contentslength;
                  pcVar7 = (char *)file->userp;
                  pFVar9 = (FormData *)(*Curl_cmalloc)(0x20);
                  if (pFVar9 == (FormData *)0x0) {
                    CVar5 = CURLE_OUT_OF_MEMORY;
                  }
                  else {
                    pFVar9->next = (FormData *)0x0;
                    pFVar9->line = pcVar7;
                    pFVar9->type = FORM_CALLBACK;
                    if (local_278 != (FormData *)0x0) {
                      local_278->next = pFVar9;
                    }
                    local_280 = local_280 + lVar2;
                    CVar5 = CURLE_OK;
                    local_278 = pFVar9;
                  }
                  goto LAB_0012f1a9;
                }
                pcVar7 = file->contents;
                length_00 = file->contentslength;
              }
              else {
                pcVar7 = file->buffer;
                length_00 = file->bufferlength;
              }
              type = FORM_CONTENT;
LAB_0012f105:
              CVar5 = AddFormData(&local_278,type,pcVar7,length_00,&local_280);
            }
            else {
              iVar6 = curl_strequal("-",post->contents);
              __stream = _stdin;
              if (iVar6 == 0) {
                __stream = fopen64(post->contents,"rb");
              }
              if (__stream == (FILE *)0x0) {
                if (local_258 != (SessionHandle *)0x0) {
                  Curl_failf(local_258,"couldn\'t open file \"%s\"",post->contents);
                }
                *local_260 = (FormData *)0x0;
                CVar5 = CURLE_READ_ERROR;
              }
              else {
                if (__stream != _stdin) {
                  fclose(__stream);
                  pcVar7 = post->contents;
                  type = FORM_FILE;
                  length_00 = 0;
                  goto LAB_0012f105;
                }
                local_240 = file;
                do {
                  length = fread(local_238,1,0x200,__stream);
                  if (length == 0) {
                    CVar5 = CURLE_OK;
                    file = local_240;
                    break;
                  }
                  CVar5 = AddFormData(&local_278,FORM_CONTENT,local_238,length,&local_280);
                  file = local_240;
                } while (CVar5 == CURLE_OK);
              }
            }
LAB_0012f1a9:
            post = post->more;
            if ((post == (curl_httppost *)0x0) || (CVar5 != CURLE_OK)) goto LAB_0012f1c8;
            goto LAB_0012ef52;
          }
          if ((file->flags & 0x51U) == 0) goto LAB_0012efc1;
          if (((file->flags & 1U) != 0) || (file->showfilename != (char *)0x0)) {
            CVar5 = formdata_add_filename(file,&local_278,&local_280);
          }
          if (CVar5 == CURLE_OK) goto LAB_0012efbe;
LAB_0012f1c8:
          pcVar7 = local_268;
          pcVar8 = local_270;
          if ((CVar5 != CURLE_OK) ||
             ((file->more != (curl_httppost *)0x0 &&
              (CVar5 = AddFormDataf(&local_278,&local_280,"\r\n--%s--",local_270), CVar5 != CURLE_OK
              )))) goto LAB_0012f211;
          post = file->next;
        } while (post != (curl_httppost *)0x0);
        CVar5 = CURLE_OK;
LAB_0012f211:
        pFVar9 = local_250;
        ppFVar4 = local_260;
        if (CVar5 == CURLE_OK) {
          CVar5 = AddFormDataf(&local_278,&local_280,"\r\n--%s--\r\n",pcVar7);
        }
        if (CVar5 == CURLE_OK) {
          *local_248 = local_280;
          (*Curl_cfree)(pcVar8);
          (*Curl_cfree)(pcVar7);
          *ppFVar4 = pFVar9;
          CVar5 = CURLE_OK;
        }
        else {
          while (pFVar9 != (FormData *)0x0) {
            pFVar3 = pFVar9->next;
            if (pFVar9->type < FORM_CALLBACK) {
              (*Curl_cfree)(pFVar9->line);
            }
            (*Curl_cfree)(pFVar9);
            pFVar9 = pFVar3;
          }
          (*Curl_cfree)(pcVar8);
          (*Curl_cfree)(pcVar7);
        }
      }
      else {
        (*Curl_cfree)(pcVar7);
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_getformdata(struct SessionHandle *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;

  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char *boundary;
  char *fileboundary = NULL;
  struct curl_slist* curList;

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  boundary = formboundary(data);
  if(!boundary)
    return CURLE_OUT_OF_MEMORY;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    free(boundary);
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      free(fileboundary);
      fileboundary = formboundary(data);
      if(!fileboundary) {
        result = CURLE_OUT_OF_MEMORY;
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf( &form, &size, "\r\n%s", curList->data );
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = strequal("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result)
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size
           is set with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->contentslength, &size);

      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }

  } while((post = post->next) != NULL); /* for each field */

  /* end-boundary for everything */
  if(!result)
    result = AddFormDataf(&form, &size, "\r\n--%s--\r\n", boundary);

  if(result) {
    Curl_formclean(&firstform);
    free(fileboundary);
    free(boundary);
    return result;
  }

  *sizep = size;

  free(fileboundary);
  free(boundary);

  *finalform = firstform;

  return result;
}